

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_DistributionMapping.cpp
# Opt level: O0

DistributionMapping
amrex::DistributionMapping::makeSFC
          (LayoutData<double> *rcost_local,Real *currentEfficiency,Real *proposedEfficiency,
          bool broadcastToAll,int root)

{
  double dVar1;
  int iVar2;
  vector<long,_std::allocator<long>_> *wgts;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var3;
  reference pdVar4;
  long lVar5;
  Long LVar6;
  double *pdVar7;
  long *plVar8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  FabArrayBase *in_RSI;
  element_type *in_RDI;
  literals *this;
  byte in_R8B;
  int in_R9D;
  longdouble lVar9;
  Real RVar10;
  DistributionMapping DVar11;
  Real *in_stack_00000030;
  Vector<double,_std::allocator<double>_> *in_stack_00000038;
  DistributionMapping *in_stack_00000040;
  int nprocs;
  int i;
  Real scale;
  Real wmax;
  Vector<long,_std::allocator<long>_> cost;
  Vector<double,_std::allocator<double>_> rcost;
  DistributionMapping *r;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffed8;
  size_type i_00;
  undefined2 in_stack_fffffffffffffee0;
  undefined2 uVar12;
  undefined6 in_stack_fffffffffffffee2;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffef0;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffef8;
  LayoutData<double> *in_stack_ffffffffffffff00;
  Real in_stack_ffffffffffffff08;
  undefined1 sort;
  Real *eff;
  BoxArray *boxes;
  element_type *this_00;
  int local_ac;
  double *local_90;
  double local_88;
  undefined1 local_79 [73];
  int local_30;
  byte local_29 [17];
  FabArrayBase *local_18;
  byte *local_8;
  
  local_29[0] = in_R8B & 1;
  this_00 = in_RDI;
  local_30 = in_R9D;
  local_18 = in_RSI;
  FabArrayBase::size((FabArrayBase *)0x11fa0a5);
  std::allocator<double>::allocator((allocator<double> *)0x11fa0be);
  Vector<double,_std::allocator<double>_>::vector
            ((Vector<double,_std::allocator<double>_> *)
             CONCAT62(in_stack_fffffffffffffee2,in_stack_fffffffffffffee0),
             (size_type)in_stack_fffffffffffffed8,(allocator_type *)0x11fa0d5);
  std::allocator<double>::~allocator((allocator<double> *)0x11fa0e4);
  ParallelDescriptor::GatherLayoutDataToVector<double>
            (in_stack_ffffffffffffff00,
             (Vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffef8._M_current,
             (int)((ulong)in_stack_fffffffffffffef0._M_current >> 0x20));
  local_79[0x1c] = 0;
  DistributionMapping((DistributionMapping *)0x11fa114);
  iVar2 = ParallelDescriptor::MyProc();
  if (iVar2 == local_30) {
    wgts = (vector<long,_std::allocator<long>_> *)
           Vector<double,_std::allocator<double>_>::size
                     ((Vector<double,_std::allocator<double>_> *)0x11fa135);
    boxes = (BoxArray *)local_79;
    std::allocator<long>::allocator((allocator<long> *)0x11fa14c);
    Vector<long,_std::allocator<long>_>::vector
              ((Vector<long,_std::allocator<long>_> *)
               CONCAT62(in_stack_fffffffffffffee2,in_stack_fffffffffffffee0),
               (size_type)in_stack_fffffffffffffed8,(allocator_type *)0x11fa163);
    std::allocator<long>::~allocator((allocator<long> *)0x11fa172);
    eff = (Real *)(local_79 + 0x31);
    std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffed8);
    std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffed8);
    _Var3 = std::
            max_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                      (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
    this = (literals *)&local_90;
    local_90 = _Var3._M_current;
    pdVar4 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *
                       )this);
    local_88 = *pdVar4;
    if ((local_88 != 0.0) || (NAN(local_88))) {
      lVar9 = (longdouble)1e+09;
      i_00 = SUB108(lVar9,0);
      uVar12 = (undefined2)((unkuint10)lVar9 >> 0x40);
      RVar10 = literals::operator____rt(this,lVar9);
      RVar10 = RVar10 / local_88;
    }
    else {
      lVar9 = (longdouble)1e+09;
      i_00 = SUB108(lVar9,0);
      uVar12 = (undefined2)((unkuint10)lVar9 >> 0x40);
      RVar10 = literals::operator____rt(this,lVar9);
      in_stack_ffffffffffffff08 = RVar10;
    }
    local_ac = 0;
    while( true ) {
      lVar5 = (long)local_ac;
      LVar6 = Vector<double,_std::allocator<double>_>::size
                        ((Vector<double,_std::allocator<double>_> *)0x11fa276);
      iVar2 = (int)((ulong)_Var3._M_current >> 0x20);
      sort = (undefined1)((ulong)in_stack_ffffffffffffff08 >> 0x38);
      if (LVar6 <= lVar5) break;
      pdVar7 = Vector<double,_std::allocator<double>_>::operator[]
                         ((Vector<double,_std::allocator<double>_> *)
                          CONCAT62(in_stack_fffffffffffffee2,uVar12),i_00);
      dVar1 = *pdVar7;
      plVar8 = Vector<long,_std::allocator<long>_>::operator[]
                         ((Vector<long,_std::allocator<long>_> *)
                          CONCAT62(in_stack_fffffffffffffee2,uVar12),i_00);
      *plVar8 = (long)(dVar1 * RVar10) + 1;
      local_ac = local_ac + 1;
    }
    ParallelDescriptor::NProcs();
    FabArrayBase::boxArray(local_18);
    SFCProcessorMap((DistributionMapping *)this_00,boxes,wgts,iVar2,eff,(bool)sort);
    FabArrayBase::DistributionMap(local_18);
    ComputeDistributionMappingEfficiency(in_stack_00000040,in_stack_00000038,in_stack_00000030);
    Vector<long,_std::allocator<long>_>::~Vector((Vector<long,_std::allocator<long>_> *)0x11fa3d6);
  }
  local_8 = local_29;
  local_79[0x1c] = 1;
  Vector<double,_std::allocator<double>_>::~Vector
            ((Vector<double,_std::allocator<double>_> *)0x11fa40f);
  DVar11.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  DVar11.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = in_RDI;
  return (DistributionMapping)
         DVar11.m_ref.
         super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

DistributionMapping
DistributionMapping::makeSFC (const LayoutData<Real>& rcost_local,
                              Real& currentEfficiency, Real& proposedEfficiency,
                              bool broadcastToAll, int root)
{
    BL_PROFILE("makeSFC");

    // Proposed distribution mapping is computed from global vector of costs on root;
    // required information is gathered on root from the layoutData information
    //
    // Two main steps:
    // 1. collect from rcost_local into the global cost vector rcost; then rcost is
    //    complete (only) on root
    // 2. (optional; default true) Broadcast processor map of the new dm to others

    Vector<Real> rcost(rcost_local.size());
    ParallelDescriptor::GatherLayoutDataToVector<Real>(rcost_local, rcost, root);
    // rcost is now filled out on root;

    DistributionMapping r;
    if (ParallelDescriptor::MyProc() == root)
    {
        Vector<Long> cost(rcost.size());

        Real wmax = *std::max_element(rcost.begin(), rcost.end());
        Real scale = (wmax == 0) ? 1.e9_rt : 1.e9_rt/wmax;

        for (int i = 0; i < rcost.size(); ++i) {
            cost[i] = Long(rcost[i]*scale) + 1L;
        }

        // `sort` needs to be false here since there's a parallel reduce function
        // in the processor map function, but we are executing only on root
        int nprocs = ParallelDescriptor::NProcs();
        r.SFCProcessorMap(rcost_local.boxArray(), cost, nprocs, proposedEfficiency, false);

        ComputeDistributionMappingEfficiency(rcost_local.DistributionMap(),
                                             rcost,
                                             &currentEfficiency);
    }

#ifdef BL_USE_MPI
    // Load-balanced distribution mapping is computed on root; broadcast the cost
    // to all proc (optional)
    if (broadcastToAll)
    {
        Vector<int> pmap(rcost_local.DistributionMap().size());
        if (ParallelDescriptor::MyProc() == root)
        {
            pmap = r.ProcessorMap();
        }

        // Broadcast vector from which to construct new distribution mapping
        ParallelDescriptor::Bcast(&pmap[0], pmap.size(), root);
        if (ParallelDescriptor::MyProc() != root)
        {
            r = DistributionMapping(pmap);
        }
    }
#else
    amrex::ignore_unused(broadcastToAll);
#endif

    return r;
}